

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O2

void __thiscall indigox::algorithm::AStarOptimisation::Initalise(AStarOptimisation *this)

{
  ElnDist *this_00;
  pointer puVar1;
  pointer ppvVar2;
  ElectronOpt *pEVar3;
  element_type *peVar4;
  AStarQueueItem *__p;
  AdjList *g;
  _List_iterator<void_*> v;
  undefined8 *puVar5;
  size_t count;
  p_AStarQueueItem init;
  long local_88;
  __shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2> local_80;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  ElnDist local_50;
  
  puVar1 = (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(&this->requiredUnchangeables_);
  std::
  _Rb_tree<std::pair<void_*,_void_*>,_std::pair<const_std::pair<void_*,_void_*>,_void_*>,_std::_Select1st<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
  ::clear(&(this->idsToVertex_)._M_t);
  std::
  vector<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
  ::clear(&(this->super_ElectronOptimisationAlgorithm).minDistributions_);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_indigox::ElnVertProp_*>,_std::_Select1st<std::pair<void_*const,_indigox::ElnVertProp_*>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_indigox::ElnVertProp_*>_>_>
  ::clear(&(this->vertexProperties_)._M_t);
  ppvVar2 = (this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar2) {
    (this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar2;
  }
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::clear(&(this->vert2pos_)._M_t);
  std::
  vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>
  ::clear((vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>
           *)&this->queue_);
  utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
  ResetIndicies(&((((this->super_ElectronOptimisationAlgorithm).parent_)->molGraph_).
                  super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super__MolGraph);
  pEVar3 = (this->super_ElectronOptimisationAlgorithm).parent_;
  this->vertMaskSize_ =
       *(size_t *)
        ((long)&((((pEVar3->elnGraph_).
                   super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super__ElnGraph).graph_.
                 super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_type + 0x28);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_70,
             (long)(pEVar3->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar3->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,0,
             (allocator<unsigned_long> *)&local_88);
  this_00 = &(this->super_ElectronOptimisationAlgorithm).previousDist_;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_00,&local_70)
  ;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(this_00);
  std::vector<void_*,_std::allocator<void_*>_>::reserve(&this->pos2vert_,this->vertMaskSize_);
  peVar4 = (((((this->super_ElectronOptimisationAlgorithm).parent_)->elnGraph_).
             super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super__ElnGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  puVar5 = *(undefined8 **)
            &((StoredVertexList *)((long)&peVar4->super_type + 0x18))->
             super__List_base<void_*,_std::allocator<void_*>_>;
  local_88 = 0;
  for (; (StoredVertexList *)puVar5 != (StoredVertexList *)((long)&peVar4->super_type + 0x18U);
      puVar5 = (undefined8 *)*puVar5) {
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (&this->pos2vert_,(value_type *)(puVar5 + 2));
    std::
    _Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
    ::_M_emplace_unique<void*&,unsigned_long&>
              ((_Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
                *)&this->vert2pos_,(void **)(puVar5 + 2),(unsigned_long *)&local_88);
    local_88 = local_88 + 1;
  }
  PopulateUniqueIDs(this);
  PopulateUnchangeables(this);
  __p = (AStarQueueItem *)operator_new(0x90);
  memset(__p,0,0x90);
  std::__shared_ptr<indigox::algorithm::AStarQueueItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<indigox::algorithm::AStarQueueItem,void>
            ((__shared_ptr<indigox::algorithm::AStarQueueItem,(__gnu_cxx::_Lock_policy)2> *)
             &local_70,__p);
  std::__shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             (__shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2> *)
             &local_70);
  PopulateInitialDistribution(this,(p_AStarQueueItem *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::
  priority_queue<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>,_indigox::algorithm::ItemCompare>
  ::push(&(this->queue_).
          super_priority_queue<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>,_indigox::algorithm::ItemCompare>
         ,(value_type *)&local_70);
  ElectronOptimisationAlgorithm::CalculateUpperLimit
            (&local_50,&this->super_ElectronOptimisationAlgorithm);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void AStarOptimisation::Initalise() {
  uniqueIDs_.clear();
  requiredUnchangeables_.clear();
  idsToVertex_.clear();
  minDistributions_.clear();
  vertexProperties_.clear();
  pos2vert_.clear();
  vert2pos_.clear();
  queue_.clear();
  parent_->molGraph_->ResetIndicies();
  
  vertMaskSize_ = parent_->elnGraph_->NumVertices();
  
  previousDist_ = ElnDist(parent_->possibleLocations_.size());
  previousDist_.reset();
  pos2vert_.reserve(vertMaskSize_);
  ElnVertIterPair vs = parent_->elnGraph_->GetVertices();
  size_t count = 0;
  for (auto v = vs.first; v != vs.second; ++v) {
    pos2vert_.push_back(*v);
    vert2pos_.emplace(*v, count);
    ++count;
  }
  
  PopulateUniqueIDs();
  PopulateUnchangeables();
  p_AStarQueueItem init = p_AStarQueueItem(new AStarQueueItem());
  PopulateInitialDistribution(init);
  queue_.push(init);
  CalculateUpperLimit();
}